

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

Error __thiscall asmjit::BaseRAPass::initGlobalLiveSpans(BaseRAPass *this)

{
  byte bVar1;
  LiveRegSpans *__s;
  long lVar2;
  size_t sStack_38;
  
  lVar2 = 0;
  do {
    bVar1 = this->_scratchRegIndexes[lVar2 + -8];
    if (bVar1 == 0) {
      __s = (LiveRegSpans *)0x0;
    }
    else {
      if ((this->_allocator)._zone == (Zone *)0x0) {
        initGlobalLiveSpans();
        return 1;
      }
      __s = (LiveRegSpans *)ZoneAllocator::_alloc(&this->_allocator,(ulong)bVar1 << 4,&sStack_38);
      if (__s == (LiveRegSpans *)0x0) {
        return 1;
      }
      memset(__s,0,(ulong)bVar1 << 4);
    }
    this->_globalLiveSpans[lVar2] = __s;
    lVar2 = lVar2 + 1;
    if (lVar2 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SPEED Error BaseRAPass::initGlobalLiveSpans() noexcept {
  for (uint32_t group = 0; group < BaseReg::kGroupVirt; group++) {
    size_t physCount = _physRegCount[group];
    LiveRegSpans* liveSpans = nullptr;

    if (physCount) {
      liveSpans = allocator()->allocT<LiveRegSpans>(physCount * sizeof(LiveRegSpans));
      if (ASMJIT_UNLIKELY(!liveSpans))
        return DebugUtils::errored(kErrorOutOfMemory);

      for (size_t physId = 0; physId < physCount; physId++)
        new(&liveSpans[physId]) LiveRegSpans();
    }

    _globalLiveSpans[group] = liveSpans;
  }

  return kErrorOk;
}